

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::GenerateDynamicInterpreterThunk(FunctionBody *this)

{
  Type *ppDynamicInterpreterThunk;
  PVOID dynamicInterpreterThunk;
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  char *message;
  char *error;
  uint lineNumber;
  FunctionInfo *pFVar6;
  
  if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0) &&
     (uVar3 = GetCountField(this,ByteCodeCount), uVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeeb,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                "The wasm function should have been parsed before generating the dynamic interpreter thunk"
                               );
    if (!bVar2) goto LAB_00765f80;
    *puVar4 = 0;
  }
  ppDynamicInterpreterThunk = &(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
  dynamicInterpreterThunk = (this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
  if (dynamicInterpreterThunk == (PVOID)0x0) {
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
      p_Var5 = ScriptContext::GetNextDynamicInterpreterThunk(this_00,ppDynamicInterpreterThunk);
    }
    else {
      p_Var5 = ScriptContext::GetNextDynamicAsmJsInterpreterThunk(this_00,ppDynamicInterpreterThunk)
      ;
    }
  }
  else {
    p_Var5 = (JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(dynamicInterpreterThunk)
    ;
  }
  pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00765f80;
    *puVar4 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar6->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_00765f80;
    *puVar4 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  FunctionInfo::SetOriginalEntryPoint(pFVar6,p_Var5);
  bVar2 = ThreadContext::TestThreadContextFlag
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     threadContext,ThreadContextFlagNoDynamicThunks);
  if (bVar2) {
    if (*ppDynamicInterpreterThunk != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf07,"(this->m_dynamicInterpreterThunk == nullptr)",
                                  "this->m_dynamicInterpreterThunk == nullptr");
      if (!bVar2) goto LAB_00765f80;
      *puVar4 = 0;
    }
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
      if (pFVar6 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00765f80;
        *puVar4 = 0;
        pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar6->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) goto LAB_00765f80;
        *puVar4 = 0;
        pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      p_Var5 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar6);
      if (p_Var5 == InterpreterStackFrame::StaticInterpreterThunk) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = 
      "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk)"
      ;
      message = 
      "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk"
      ;
      lineNumber = 0xf0f;
    }
    else {
      if (pFVar6 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00765f80;
        *puVar4 = 0;
        pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar6->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) goto LAB_00765f80;
        *puVar4 = 0;
        pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      p_Var5 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar6);
      if (p_Var5 == InterpreterStackFrame::StaticInterpreterAsmThunk) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = 
      "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk)"
      ;
      message = 
      "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk"
      ;
      lineNumber = 0xf0b;
    }
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,lineNumber,error,message);
    if (!bVar2) {
LAB_00765f80:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void FunctionBody::GenerateDynamicInterpreterThunk()
    {
        AssertOrFailFastMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "The wasm function should have been parsed before generating the dynamic interpreter thunk");

        if (this->m_dynamicInterpreterThunk == nullptr)
        {
            // NOTE: Etw rundown thread may be reading this->dynamicInterpreterThunk concurrently. We don't need to synchronize
            // access as it is ok for etw rundown to get either null or updated new value.

            if (m_isAsmJsFunction)
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicAsmJsInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            else
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            if (this->m_dynamicInterpreterThunk != nullptr)
            {
                JS_ETW(EtwTrace::LogMethodInterpreterThunkLoadEvent(this));
            }
        }
        else
        {
            this->SetOriginalEntryPoint((JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(this->m_dynamicInterpreterThunk));
        }

#if DBG
        if (GetScriptContext()->GetThreadContext()->NoDynamicThunks())
        {
            Assert(this->m_dynamicInterpreterThunk == nullptr);
#ifdef ASMJS_PLAT
            if (m_isAsmJsFunction)
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk);
            }
            else
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
            }
#else
            Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
#endif
        }
#endif
    }